

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

bool __thiscall kratos::IRNode::has_attribute(IRNode *this,string *value_str)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  string *value_str_local;
  IRNode *this_local;
  
  __first = std::
            vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
            ::begin(&this->attributes_);
  __last = std::
           vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ::end(&this->attributes_);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Attribute>const*,std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>>,kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                    ((__normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
                      )__last._M_current,(anon_class_8_1_e7f9e503_for__M_pred)value_str);
  return bVar1;
}

Assistant:

bool IRNode::has_attribute(const std::string &value_str) const {
    return std::any_of(attributes_.begin(), attributes_.end(),
                       [&](auto const &attr) { return attr->value_str == value_str; });
}